

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  rnndb *db_00;
  rnndeccontext *ctx;
  ulonglong uVar3;
  rnnenum *prVar4;
  rnnbitset *prVar5;
  rnndomain *domain;
  rnndecaddrinfo *a;
  char *__ptr;
  char *res;
  rnndecaddrinfo *info;
  rnndomain *dom;
  rnnbitset *bs;
  int dec;
  int i;
  rnnenum *en;
  rnndb *db;
  int ret;
  rnndeccontext *vc;
  uint64_t val;
  uint64_t colors;
  uint64_t reg;
  int local_38;
  int chip;
  int mode;
  int c;
  char *variant;
  char *name;
  char *file;
  char **argv_local;
  int argc_local;
  
  name = "root.xml";
  variant = "NV_MMIO";
  _mode = (char *)0x0;
  local_38 = 100;
  reg._4_4_ = 0;
  bVar1 = true;
  vc = (rnndeccontext *)0x0;
  rnn_init();
  if (argc < 2) {
    usage();
  }
  db_00 = rnn_newdb();
  while (iVar2 = getopt(argc,argv,"f:a:d:e:b:c"), iVar2 != -1) {
    switch(iVar2) {
    case 0x61:
      uVar3 = strtoull(_optarg,(char **)0x0,0x10);
      reg._4_4_ = (int)uVar3;
      if (reg._4_4_ == 0) {
        _mode = strdup(_optarg);
      }
      else {
        free(_mode);
        _mode = (char *)0x0;
      }
      break;
    case 0x62:
      local_38 = 0x62;
      variant = strdup(_optarg);
      break;
    case 99:
      bVar1 = false;
      break;
    case 100:
      local_38 = 100;
      variant = strdup(_optarg);
      break;
    case 0x65:
      local_38 = 0x65;
      variant = strdup(_optarg);
      break;
    case 0x66:
      name = strdup(_optarg);
      break;
    default:
      usage();
    }
  }
  rnn_parsefile(db_00,name);
  rnn_prepdb(db_00);
  ctx = rnndec_newcontext(db_00);
  if (bVar1) {
    ctx->colors = &envy_def_colors;
  }
  if (_mode == (char *)0x0) {
    if (reg._4_4_ != 0) {
      rnndec_varaddvalue(ctx,"chipset",(long)reg._4_4_);
    }
  }
  else {
    rnndec_varadd(ctx,"chipset",_mode);
  }
  while (iVar2 = strcmp(argv[_optind],"-v"), iVar2 == 0) {
    rnndec_varadd(ctx,argv[_optind + 1],argv[_optind + 2]);
    _optind = _optind + 3;
  }
  if (_optind < argc) {
    uVar3 = strtoull(argv[_optind],(char **)0x0,0x10);
    if (_optind + 1 < argc) {
      vc = (rnndeccontext *)strtoull(argv[_optind + 1],(char **)0x0,0x10);
    }
    if (local_38 == 0x65) {
      prVar4 = rnn_findenum(db_00,variant);
      if (prVar4 == (rnnenum *)0x0) {
        fprintf(_stderr,"Not an enum: \'%s\'\n",variant);
        db._4_4_ = 1;
      }
      else {
        bVar1 = false;
        for (bs._4_4_ = 0; bs._4_4_ < prVar4->valsnum; bs._4_4_ = bs._4_4_ + 1) {
          if ((prVar4->vals[bs._4_4_]->valvalid != 0) && (prVar4->vals[bs._4_4_]->value == uVar3)) {
            printf("%s\n",prVar4->vals[bs._4_4_]->name);
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          printf("%#lx\n",uVar3);
        }
        db._4_4_ = 0;
      }
    }
    else if (local_38 == 0x62) {
      prVar5 = rnn_findbitset(db_00,variant);
      if (prVar5 == (rnnbitset *)0x0) {
        fprintf(_stderr,"Not a bitset: \'%s\'\n",variant);
      }
      else {
        printf("TODO\n");
      }
      db._4_4_ = (uint)(prVar5 == (rnnbitset *)0x0);
    }
    else if (local_38 == 100) {
      domain = rnn_finddomain(db_00,variant);
      if (domain == (rnndomain *)0x0) {
        fprintf(_stderr,"Not a domain: \'%s\'\n",variant);
        db._4_4_ = 1;
      }
      else {
        a = rnndec_decodeaddr(ctx,domain,uVar3,0);
        if ((a == (rnndecaddrinfo *)0x0) || (a->typeinfo == (rnntypeinfo *)0x0)) {
          if (a != (rnndecaddrinfo *)0x0) {
            printf("%s\n",a->name);
            rnndec_free_decaddrinfo(a);
          }
          db._4_4_ = (uint)(a == (rnndecaddrinfo *)0x0);
        }
        else {
          __ptr = rnndec_decodeval(ctx,a->typeinfo,(uint64_t)vc,a->width);
          printf("%s => %s\n",a->name,__ptr);
          free(__ptr);
          rnndec_free_decaddrinfo(a);
          db._4_4_ = 0;
        }
      }
    }
    else {
      db._4_4_ = 1;
    }
    rnndec_freecontext(ctx);
    rnn_freedb(db_00);
    rnn_fini();
    argv_local._4_4_ = db._4_4_;
  }
  else {
    fprintf(_stderr,"No address specified.\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	char *file = "root.xml";
	char *name = "NV_MMIO";
	char *variant = NULL;
	int c, mode = 'd', chip = 0;
	uint64_t reg, colors=1, val = 0;
	struct rnndeccontext *vc;
	int ret;

	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "f:a:d:e:b:c")) != -1) {
		switch (c) {
			case 'f':
				file = strdup(optarg);
				break;
			case 'e':
				mode = 'e';
				name = strdup(optarg);
				break;
			case 'b':
				mode = 'b';
				name = strdup(optarg);
				break;
			case 'd':
				mode = 'd';
				name = strdup(optarg);
				break;
			case 'a':
				chip = strtoull(optarg, NULL, 16);
				if (!chip)
					variant = strdup(optarg);
				else {
					free(variant);
					variant = NULL;
				}
				break;
			case 'c':
				colors = 0;
				break;
			default: usage();
		}
	}

	rnn_parsefile (db, file);
	rnn_prepdb (db);
	vc = rnndec_newcontext(db);
	if(colors)
		vc->colors = &envy_def_colors;

	if (variant)
		rnndec_varadd(vc, "chipset", variant);
	else if (chip)
		rnndec_varaddvalue(vc, "chipset",  chip);

	/* Parse extra arguments */
	while (!strcmp (argv[optind], "-v")) {
		rnndec_varadd(vc, argv[optind+1], argv[optind+2]);
		optind+=3;
	}

	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}

	reg = strtoull(argv[optind], 0, 16);
	if (optind + 1 < argc)
		val = strtoull(argv[optind + 1], 0, 16);

	if (mode == 'e') {
		struct rnnenum *en = rnn_findenum (db, name);
		if (en) {
			int i;
			int dec = 0;
			for (i = 0; i < en->valsnum; i++)
				if (en->vals[i]->valvalid && en->vals[i]->value == reg) {
					printf ("%s\n", en->vals[i]->name);
					dec = 1;
					break;
				}
			if (!dec)
				printf ("%#"PRIx64"\n", reg);

			ret = 0;
		} else {
			fprintf(stderr, "Not an enum: '%s'\n", name);
			ret = 1;
		}
	} else if (mode == 'b') {
		struct rnnbitset *bs = rnn_findbitset (db, name);

		if (bs) {
			printf("TODO\n");
			ret = 0;
		} else {
			fprintf(stderr, "Not a bitset: '%s'\n", name);
			ret = 1;
		}

	} else if (mode == 'd') {
		struct rnndomain *dom = rnn_finddomain (db, name);

		if (dom) {
			struct rnndecaddrinfo *info = rnndec_decodeaddr(vc, dom, reg, 0);
			if (info && info->typeinfo) {
				char *res = rnndec_decodeval(vc, info->typeinfo, val, info->width);
				printf ("%s => %s\n", info->name, res);
				free(res);
				rnndec_free_decaddrinfo(info);
				ret = 0;
			} else if (info) {
				printf ("%s\n", info->name);
				rnndec_free_decaddrinfo(info);
				ret = 0;
			} else
				ret = 1;
		} else {
			fprintf(stderr, "Not a domain: '%s'\n", name);
			ret = 1;
		}
	} else {
		ret = 1;
	}

	rnndec_freecontext(vc);
	rnn_freedb(db);
	rnn_fini();

	return ret;
}